

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int is_item_discoverable_interior(tgestate_t *state,room_t room,item_t *pitem)

{
  byte bVar1;
  item_t item;
  uint8_t iters;
  itemstruct_t *itemstr;
  item_t *pitem_local;
  room_t room_local;
  tgestate_t *state_local;
  
  itemstr = state->item_structs;
  iters = '\x10';
  while ((((itemstr->room_and_flags & 0x3f) != room ||
          (default_item_locations[(int)(itemstr->item_and_flags & 0xf)].room_and_flags == room)) ||
         (bVar1 = itemstr->item_and_flags & 0xf, bVar1 == 0xc))) {
    itemstr = itemstr + 1;
    iters = iters + 0xff;
    if (iters == '\0') {
      return 1;
    }
  }
  if (pitem != (item_t *)0x0) {
    *pitem = bVar1;
  }
  return 0;
}

Assistant:

int is_item_discoverable_interior(tgestate_t *state,
                                  room_t      room,
                                  item_t     *pitem)
{
  const itemstruct_t *itemstr; /* was HL */
  uint8_t             iters;   /* was B */
  item_t              item;    /* was A */

  assert(state != NULL);
  ASSERT_ROOM_VALID(room);
  /* pitem may be NULL */

  itemstr = &state->item_structs[0];
  iters   = item__LIMIT;
  do
  {
    /* Is the item in the specified room? */
    if ((itemstr->room_and_flags & itemstruct_ROOM_MASK) == room &&
        /* Has the item been moved to a different room? */
        /* BUG: room_and_flags doesn't get its flag bits masked off.
         * Does it need & 0x3F ? */ // FUTURE: add an assert to check this
        // wiresnips' room_and_flags is 255 so will never match 'room' (0..room_limit)
        // so the effect is ... wiresnips are always discoverable?
        default_item_locations[itemstr->item_and_flags & itemstruct_ITEM_MASK].room_and_flags != room)
    {
      item = itemstr->item_and_flags & itemstruct_ITEM_MASK;

      /* Ignore the red cross parcel. */
      if (item != item_RED_CROSS_PARCEL)
      {
        if (pitem) /* Conv: Added to support return of pitem. */
          *pitem = item;

        return 0; /* found */
      }
    }

    itemstr++;
  }
  while (--iters);

  return 1; /* not found */
}